

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asp_preprocessor.cpp
# Opt level: O1

bool __thiscall Clasp::Asp::Preprocessor::preprocessEq(Preprocessor *this,uint32 maxIters)

{
  undefined1 *puVar1;
  uint *puVar2;
  pointer ppPVar3;
  size_type sVar4;
  LogicProgram *pLVar5;
  pointer ppPVar6;
  pointer ppPVar7;
  ulong *puVar8;
  SharedContext *this_00;
  bool bVar9;
  ValueRep VVar10;
  uint uVar11;
  pointer ppPVar12;
  ulong uVar13;
  VarVec *supported;
  long lVar14;
  HeadRange atoms;
  BodyExtra local_44;
  HeadRange local_40;
  
  pLVar5 = this->prg_;
  sVar4 = (((pLVar5->super_ProgramBuilder).ctx_)->varInfo_).ebo_.size;
  this->pass_ = 0;
  this->maxPass_ = maxIters;
  ppPVar6 = (pLVar5->atoms_).ebo_.buf;
  ppPVar3 = ppPVar6 + (pLVar5->input_).lo;
  ppPVar6 = ppPVar6 + (pLVar5->atoms_).ebo_.size;
  local_44 = (BodyExtra)0x0;
  local_40.first = (PrgHead **)ppPVar3;
  local_40.second = (PrgHead **)ppPVar6;
  bk_lib::
  pod_vector<Clasp::Asp::Preprocessor::BodyExtra,_std::allocator<Clasp::Asp::Preprocessor::BodyExtra>_>
  ::resize(&this->bodyInfo_,(pLVar5->bodies_).ebo_.size + 1,&local_44);
  while( true ) {
    uVar11 = this->pass_ + 1;
    this->pass_ = uVar11;
    if (1 < uVar11) {
      ppPVar12 = (this->prg_->atoms_).ebo_.buf;
      while (ppPVar12 != ppPVar6) {
        for (; ppPVar12 != ppPVar3; ppPVar12 = ppPVar12 + 1) {
          puVar1 = &((*ppPVar12)->super_PrgHead).field_0x18;
          *(uint *)puVar1 = *(uint *)puVar1 & 0xf7ffffff;
        }
        for (; ppPVar12 != ppPVar6; ppPVar12 = ppPVar12 + 1) {
          ((*ppPVar12)->super_PrgHead).super_PrgNode =
               (PrgNode)(((ulong)((*ppPVar12)->super_PrgHead).super_PrgNode & 0xffffffff80000000) +
                        1);
          puVar1 = &((*ppPVar12)->super_PrgHead).field_0x18;
          *(uint *)puVar1 = *(uint *)puVar1 & 0xf7ffffff;
        }
      }
      uVar13 = (ulong)(this->prg_->disjunctions_).ebo_.size;
      if (uVar13 != 0) {
        ppPVar7 = (this->prg_->disjunctions_).ebo_.buf;
        lVar14 = 0;
        do {
          puVar8 = *(ulong **)((long)ppPVar7 + lVar14);
          *puVar8 = (*puVar8 & 0xffffffff80000000) + 1;
          puVar2 = (uint *)(*(long *)((long)ppPVar7 + lVar14) + 0x18);
          *puVar2 = *puVar2 & 0xf7ffffff;
          lVar14 = lVar14 + 8;
        } while (uVar13 << 3 != lVar14);
      }
      this_00 = (this->prg_->super_ProgramBuilder).ctx_;
      SharedContext::popVars(this_00,(this_00->varInfo_).ebo_.size - sVar4);
      (this->litToNode_).ebo_.size = 0;
    }
    supported = LogicProgram::getSupportedBodies(this->prg_,true);
    bVar9 = classifyProgram(this,supported);
    if (!bVar9) break;
    VVar10 = simplifyClassifiedProgram(this,&local_40,this->pass_ != this->maxPass_,supported);
    if ((VVar10 != '\0') || (this->pass_ == this->maxPass_)) {
      return VVar10 != '\x02';
    }
  }
  return false;
}

Assistant:

bool Preprocessor::preprocessEq(uint32 maxIters) {
	uint32 startVar = prg_->ctx()->numVars();
	ValueRep res    = value_true;
	pass_           = 0;
	maxPass_        = maxIters;
	HeadRange atoms = HeadRange(prg_->atom_begin() + prg_->startAtom(), prg_->atom_end());
	bodyInfo_.resize( prg_->numBodies() + 1 );
	do {
		if (++pass_ > 1) {
			for (HeadIter it = prg_->atom_begin(), end = atoms.second; it != end; ) {
				while (it != atoms.first){ (*it)->setInUpper(false); ++it; }
				while (it != end)        { (*it)->clearLiteral(false); (*it)->setInUpper(false); ++it; }
			}
			for (HeadIter it = prg_->disj_begin(), end = prg_->disj_end(); it != end; ++it) {
				(*it)->clearLiteral(false);
				(*it)->setInUpper(false);
			}
			prg_->ctx()->popVars(prg_->ctx()->numVars() - startVar);
			litToNode_.clear();
		}
		VarVec& supported = prg_->getSupportedBodies(true);
		if (!classifyProgram(supported)) { return false; }
		res = simplifyClassifiedProgram(atoms, pass_ != maxPass_, supported);
	} while (res == value_free && pass_ != maxPass_);
	return res != value_false;
}